

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint32 __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  long lVar1;
  uint8 *puVar2;
  bool bVar3;
  uint8 *puVar4;
  int iVar5;
  uint32 uVar7;
  long lVar8;
  uint64 uStack_10;
  int iVar6;
  
  puVar2 = this->buffer_;
  iVar6 = (int)this->buffer_end_;
  iVar5 = iVar6 - (int)puVar2;
  if (9 < iVar5) {
LAB_0024f5e2:
    if (first_byte_or_zero == 0) {
      this->buffer_ = puVar2 + 1;
      return 0;
    }
    uVar7 = ((uint)puVar2[1] * 0x80 + first_byte_or_zero) - 0x80;
    if ((char)puVar2[1] < '\0') {
      uVar7 = (uVar7 + (uint)puVar2[2] * 0x4000) - 0x4000;
      if ((char)puVar2[2] < '\0') {
        uVar7 = (uVar7 + (uint)puVar2[3] * 0x200000) - 0x200000;
        if ((char)puVar2[3] < '\0') {
          puVar4 = puVar2 + 5;
          uVar7 = uVar7 + (uint)puVar2[4] * 0x10000000 + 0xf0000000;
          if ((char)puVar2[4] < '\0') {
            lVar8 = 0;
            do {
              if ((int)lVar8 == 5) {
                return 0;
              }
              lVar1 = lVar8 + 1;
              puVar2 = puVar4 + lVar8;
              lVar8 = lVar1;
            } while ((char)*puVar2 < '\0');
            puVar4 = puVar4 + lVar1;
          }
        }
        else {
          puVar4 = puVar2 + 4;
        }
      }
      else {
        puVar4 = puVar2 + 3;
      }
    }
    else {
      puVar4 = puVar2 + 2;
    }
    this->buffer_ = puVar4;
    return uVar7;
  }
  if (iVar5 < 1) {
    if (iVar6 == (int)puVar2) {
      if (((0 < this->buffer_size_after_limit_) || (this->total_bytes_read_ == this->current_limit_)
          ) && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)
         ) {
        this->legitimate_message_end_ = true;
        return 0;
      }
    }
  }
  else if (-1 < (char)this->buffer_end_[-1]) goto LAB_0024f5e2;
  if ((this->buffer_ != this->buffer_end_) || (bVar3 = Refresh(this), bVar3)) {
    uStack_10 = 0;
    bVar3 = ReadVarint64(this,&uStack_10);
    uVar7 = 0;
    if (bVar3) {
      uVar7 = (uint32)uStack_10;
    }
  }
  else {
    if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
      this->legitimate_message_end_ = true;
    }
    else {
      this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
    }
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return static_cast<int>(buffer_end_ - buffer_);
}